

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  FILE *__s;
  known_host *node;
  size_t sVar5;
  char *errmsg;
  LIBSSH2_SESSION *session;
  size_t wrote;
  char buffer [4092];
  size_t local_1040;
  char local_1038 [4104];
  
  if (type == 1) {
    __s = fopen(filename,"w");
    if (__s != (FILE *)0x0) {
      node = (known_host *)_libssh2_list_first(&hosts->head);
      if (node == (known_host *)0x0) {
        iVar4 = 0;
      }
      else {
        do {
          local_1040 = 0;
          iVar3 = knownhost_writeline(hosts,node,local_1038,0xffc,&local_1040,1);
          sVar2 = local_1040;
          iVar4 = 0;
          if (iVar3 == 0) {
            sVar5 = fwrite(local_1038,1,local_1040,__s);
            bVar1 = true;
            if (sVar5 != sVar2) {
              iVar4 = _libssh2_error(hosts->session,-0x10,"Write failed");
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
            iVar4 = iVar3;
          }
        } while ((bVar1) &&
                (node = (known_host *)_libssh2_list_next(&node->node), node != (known_host *)0x0));
      }
      fclose(__s);
      return iVar4;
    }
    session = hosts->session;
    errmsg = "Failed to open file";
    iVar4 = -0x10;
  }
  else {
    session = hosts->session;
    errmsg = "Unsupported type of known-host information store";
    iVar4 = -0x21;
  }
  iVar4 = _libssh2_error(session,iVar4,errmsg);
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,
                            const char *filename, int type)
{
    struct known_host *node;
    FILE *file;
    int rc = LIBSSH2_ERROR_NONE;
    char buffer[4092];

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_WRITETEXT);
    if(!file)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    for(node = _libssh2_list_first(&hosts->head);
        node;
        node = _libssh2_list_next(&node->node)) {
        size_t wrote = 0;
        size_t nwrote;
        rc = knownhost_writeline(hosts, node, buffer, sizeof(buffer), &wrote,
                                 type);
        if(rc)
            break;

        nwrote = fwrite(buffer, 1, wrote, file);
        if(nwrote != wrote) {
            /* failed to write the whole thing, bail out */
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                                "Write failed");
            break;
        }
    }
    fclose(file);

    return rc;
}